

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

string * spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::to_string__abi_cxx11_
                   (string_view_t *sv)

{
  char *__n;
  char *__s;
  basic_string_view<char> *in_RSI;
  string *in_RDI;
  string *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string_view<char> *local_10;
  
  __a = in_RDI;
  local_10 = in_RSI;
  __n = ::fmt::v11::basic_string_view<char>::data(in_RSI);
  __s = (char *)::fmt::v11::basic_string_view<char>::size(local_10);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &stack0xffffffffffffffef;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,__s,(size_type)__n,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE std::string ansicolor_sink<ConsoleMutex>::to_string_(const string_view_t &sv) {
    return std::string(sv.data(), sv.size());
}